

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statamain.cpp
# Opt level: O2

ST_retcode stata_call(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  pointer pMVar4;
  uint dim;
  uint uVar5;
  ST_int SVar6;
  Scalar *pSVar7;
  ST_retcode SVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  star;
  VectorXd v;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  vertices;
  vector<int,_std::allocator<int>_> edges;
  
  if (argc == 2) {
    pcVar1 = *argv;
    pcVar2 = argv[1];
    star.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    star.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    star.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dim = (*_stata_->colsof)(pcVar1);
    uVar5 = (*_stata_->rowsof)(pcVar1);
    if (dim == 0 || uVar5 == 0) {
      SVar8 = 0xc6;
      myprintf("Invalid rows/columns\n");
    }
    else {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&v,(ulong)dim);
      for (uVar9 = 1; uVar9 <= uVar5; uVar9 = uVar9 + 1) {
        uVar11 = 1;
        while (uVar10 = (uint)uVar11, uVar10 <= dim) {
          SVar6 = (*_stata_->safematel)(pcVar1,uVar9,uVar10,(ST_double *)&vertices);
          pMVar4 = vertices.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (SVar6 != 0) {
            myprintf("Error while reading value at [%d,%d]\n",(ulong)uVar9,uVar11);
            SVar8 = 0xc6;
            goto LAB_00112b00;
          }
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&v,
                              (ulong)(uVar10 - 1));
          *pSVar7 = (Scalar)pMVar4;
          uVar11 = (ulong)(uVar10 + 1);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(&star,(value_type *)&v);
      }
      vertices.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vertices.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vertices.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      dVar3 = zonotope_volume(&star,&vertices,&edges,dim);
      SVar6 = (*_stata_->scalsave)(pcVar2,dVar3);
      if (SVar6 == 0) {
        SVar8 = 0;
      }
      else {
        SVar8 = 0xc6;
        myprintf("Unable to save result\n");
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&edges.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&vertices);
LAB_00112b00:
      free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&star);
  }
  else {
    myprintf("Invalid arguments\n");
    SVar8 = 0xc6;
  }
  return SVar8;
}

Assistant:

STDLL stata_call(int argc, char *argv[])
{
	dbgprintf("\nSTATA_ZONOTOPE_PLUGIN_BEGIN\n");

	if (argc != 2)
	{
		myprintf("Invalid arguments\n");
		return 198;
	}

	char *mat = argv[0];
	char *scal = argv[1];

	std::vector<Eigen::VectorXd> star;

	unsigned int cols = SF_col(mat);
	unsigned int rows = SF_row(mat);

	if (!((cols > 0) && (rows > 0)))
	{
		myprintf("Invalid rows/columns\n");
		return 198;
	}

	Eigen::VectorXd v(cols);
	for (unsigned int i = 1; i <= rows; i++)
	{
		for (unsigned int j = 1; j <= cols; j++ )
		{
			ST_double z;
			if (SF_mat_el(mat, i, j, &z))
			{
				myprintf("Error while reading value at [%d,%d]\n", i, j);
				return 198;
			}
			v[j - 1] = z;
		}
		star.push_back(v);
	}

	std::vector<Eigen::VectorXd> vertices;
	std::vector<int> edges;

	double volume = zonotope_volume(star, vertices, edges, cols);

	if (SF_scal_save(scal, volume))
	{
		myprintf("Unable to save result\n");
		return 198;
	}

	dbgprintf("\nSTATA_ZONOTOPE_PLUGIN_END\n");
	return 0;
}